

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_new(lua_State *L,char *str)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_t l;
  TString *pTVar5;
  bool bVar6;
  
  iVar3 = (int)(((ulong)str & 0xffffffff) * 0x3521cfb3 >> 0x20);
  puVar1 = (undefined8 *)
           ((long)L->l_G->strcache[0] +
           (ulong)(((int)str + (((uint)((int)str - iVar3) >> 1) + iVar3 >> 5) * -0x35) * 0x10));
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    pTVar5 = (TString *)puVar1[lVar4];
    iVar3 = strcmp(str,(char *)(pTVar5 + 1));
    if (iVar3 == 0) {
      return pTVar5;
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar6);
  puVar1[1] = *puVar1;
  l = strlen(str);
  pTVar5 = luaS_newlstr(L,str,l);
  *puVar1 = pTVar5;
  return pTVar5;
}

Assistant:

TString *luaS_new (lua_State *L, const char *str) {
  unsigned int i = point2uint(str) % STRCACHE_N;  /* hash */
  int j;
  TString **p = G(L)->strcache[i];
  for (j = 0; j < STRCACHE_M; j++) {
    if (strcmp(str, getstr(p[j])) == 0)  /* hit? */
      return p[j];  /* that is it */
  }
  /* normal route */
  for (j = STRCACHE_M - 1; j > 0; j--)
    p[j] = p[j - 1];  /* move out last element */
  /* new element is first in the list */
  p[0] = luaS_newlstr(L, str, strlen(str));
  return p[0];
}